

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::leave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int leaveIdx,bool polish)

{
  double dVar1;
  bool bVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  undefined8 uVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  int *piVar10;
  pointer pnVar11;
  undefined8 uVar12;
  char cVar13;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar14;
  int32_t iVar15;
  bool bVar16;
  int iVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  int extraout_var;
  undefined4 extraout_var_00;
  SPxOut *pSVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined7 in_register_00000011;
  uint uVar23;
  fpclass_type fVar24;
  ulong uVar25;
  ulong uVar26;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar27;
  pointer pnVar28;
  pointer pnVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  cpp_dec_float<200u,int,void> *pcVar31;
  cpp_dec_float<200U,_int,_void> *pcVar32;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar33;
  type *ptVar34;
  uint *puVar35;
  pointer pnVar36;
  undefined4 *puVar37;
  cpp_dec_float<200U,_int,_void> *pcVar38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar39;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar40;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar41;
  long in_FS_OFFSET;
  byte bVar42;
  Real RVar43;
  Status leaveStat;
  int leaveNum;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ca8;
  uint local_c9c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c98;
  undefined8 uStack_c90;
  long local_c80;
  long local_c78;
  DataKey local_c70;
  SPxId leaveId;
  SPxId none;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterBound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  reject_treshold;
  cpp_dec_float<200U,_int,_void> local_ab8;
  fpclass_type local_a38;
  undefined8 uStack_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leaveMax;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [13];
  undefined3 uStack_8bb;
  int iStack_8b8;
  undefined1 uStack_8b4;
  undefined8 local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLBbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newUBbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newCoPrhs;
  uint local_620 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  cpp_dec_float<200U,_int,_void> local_530;
  uint local_4b0 [28];
  int local_440;
  undefined1 local_43c;
  fpclass_type local_438;
  int32_t iStack_434;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar42 = 0;
  local_c98 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_c98._4_4_,(int)CONCAT71(in_register_00000011,polish));
  bVar2 = this->instableLeave;
  pUVar3 = this->theCoPvec;
  if (((pUVar3->thedelta).setupStatus == true) && ((pUVar3->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::coSolve(&this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&pUVar3->thedelta,
              &(this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[leaveIdx].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  }
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x86])(this);
  leaveId.super_DataKey.info = 0;
  leaveId.super_DataKey.idx = -1;
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  leaveMax.m_backend.fpclass = cpp_dec_float_finite;
  leaveMax.m_backend.prec_elem = 0x1c;
  leaveMax.m_backend.data._M_elems[0] = 0;
  leaveMax.m_backend.data._M_elems[1] = 0;
  leaveMax.m_backend.data._M_elems[2] = 0;
  leaveMax.m_backend.data._M_elems[3] = 0;
  leaveMax.m_backend.data._M_elems[4] = 0;
  leaveMax.m_backend.data._M_elems[5] = 0;
  leaveMax.m_backend.data._M_elems[6] = 0;
  leaveMax.m_backend.data._M_elems[7] = 0;
  leaveMax.m_backend.data._M_elems[8] = 0;
  leaveMax.m_backend.data._M_elems[9] = 0;
  leaveMax.m_backend.data._M_elems[10] = 0;
  leaveMax.m_backend.data._M_elems[0xb] = 0;
  leaveMax.m_backend.data._M_elems[0xc] = 0;
  leaveMax.m_backend.data._M_elems[0xd] = 0;
  leaveMax.m_backend.data._M_elems[0xe] = 0;
  leaveMax.m_backend.data._M_elems[0xf] = 0;
  leaveMax.m_backend.data._M_elems[0x10] = 0;
  leaveMax.m_backend.data._M_elems[0x11] = 0;
  leaveMax.m_backend.data._M_elems[0x12] = 0;
  leaveMax.m_backend.data._M_elems[0x13] = 0;
  leaveMax.m_backend.data._M_elems[0x14] = 0;
  leaveMax.m_backend.data._M_elems[0x15] = 0;
  leaveMax.m_backend.data._M_elems[0x16] = 0;
  leaveMax.m_backend.data._M_elems[0x17] = 0;
  leaveMax.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  leaveMax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leaveMax.m_backend.exp = 0;
  leaveMax.m_backend.neg = false;
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x1c;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems[8] = 0;
  leavebound.m_backend.data._M_elems[9] = 0;
  leavebound.m_backend.data._M_elems[10] = 0;
  leavebound.m_backend.data._M_elems[0xb] = 0;
  leavebound.m_backend.data._M_elems[0xc] = 0;
  leavebound.m_backend.data._M_elems[0xd] = 0;
  leavebound.m_backend.data._M_elems[0xe] = 0;
  leavebound.m_backend.data._M_elems[0xf] = 0;
  leavebound.m_backend.data._M_elems[0x10] = 0;
  leavebound.m_backend.data._M_elems[0x11] = 0;
  leavebound.m_backend.data._M_elems[0x12] = 0;
  leavebound.m_backend.data._M_elems[0x13] = 0;
  leavebound.m_backend.data._M_elems[0x14] = 0;
  leavebound.m_backend.data._M_elems[0x15] = 0;
  leavebound.m_backend.data._M_elems[0x16] = 0;
  leavebound.m_backend.data._M_elems[0x17] = 0;
  leavebound.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  local_8b0._0_4_ = cpp_dec_float_finite;
  local_8b0._4_4_ = 0x1c;
  local_928 = (undefined1  [16])0x0;
  local_918 = (undefined1  [16])0x0;
  local_908 = (undefined1  [16])0x0;
  local_8f8 = (undefined1  [16])0x0;
  local_8e8 = (undefined1  [16])0x0;
  local_8d8 = (undefined1  [16])0x0;
  local_8c8 = SUB1613((undefined1  [16])0x0,0);
  uStack_8bb = 0;
  iStack_8b8 = 0;
  uStack_8b4 = 0;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x7f])(this,(ulong)(uint)leaveIdx,&leaveStat);
  if (((char)local_c98 == '\0') && (this->m_maxCycle < this->m_numCycle)) {
    if (leaveMax.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0050d24e:
      lVar20 = 0x458;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&t.m_backend,0,(type *)0x0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&leaveMax.m_backend,&t.m_backend);
      lVar20 = 0x460;
      if (iVar17 < 1) goto LAB_0050d24e;
    }
    (**(code **)((long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._vptr_ClassArray + lVar20))(this);
    pcVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
    pcVar32 = pcVar18;
    pnVar30 = &this->m_nonbasicValue;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (this->m_nonbasicValue).m_backend.exp = pcVar18->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar18->neg;
    iVar15 = pcVar18->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar18->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar15;
    this->m_nonbasicValueUpToDate = false;
  }
  pnVar30 = &leaveMax;
  pcVar32 = &local_ab8;
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pcVar32->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
    pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
  }
  local_ab8.exp = leaveMax.m_backend.exp;
  local_ab8.neg = leaveMax.m_backend.neg;
  local_ab8.fpclass = leaveMax.m_backend.fpclass;
  local_ab8.prec_elem = leaveMax.m_backend.prec_elem;
  this->boundflips = 0;
  pnVar30 = &this->theShift;
  puVar35 = local_620;
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    *puVar35 = (pnVar30->m_backend).data._M_elems[0];
    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
  }
  iVar17 = (this->theShift).m_backend.exp;
  bVar16 = (this->theShift).m_backend.neg;
  uVar4._0_4_ = (this->theShift).m_backend.fpclass;
  uVar4._4_4_ = (this->theShift).m_backend.prec_elem;
  local_c9c = leaveIdx;
  local_c70.info =
       (*this->theratiotester->_vptr_SPxRatioTester[8])
                 (this->theratiotester,&local_ab8,(ulong)(uint)leaveIdx,(ulong)local_c98 & 0xff);
  local_c70.idx = extraout_var;
  pnVar30 = &this->theShift;
  pnVar33 = &local_b0;
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pnVar33->m_backend).data._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar33 + ((ulong)bVar42 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (this->theShift).m_backend.exp;
  local_b0.m_backend.neg = (this->theShift).m_backend.neg;
  local_b0.m_backend.fpclass = (this->theShift).m_backend.fpclass;
  local_b0.m_backend.prec_elem = (this->theShift).m_backend.prec_elem;
  puVar35 = local_620;
  pnVar30 = &local_130;
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pnVar30->m_backend).data._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = iVar17;
  local_130.m_backend.neg = bVar16;
  local_130.m_backend._120_8_ = uVar4;
  RVar43 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  bVar16 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     (&local_b0,&local_130,RVar43);
  if (bVar16) {
    pcVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
    pcVar32 = pcVar18;
    pnVar30 = &this->m_nonbasicValue;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (this->m_nonbasicValue).m_backend.exp = pcVar18->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar18->neg;
    iVar15 = pcVar18->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar18->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar15;
    this->m_nonbasicValueUpToDate = false;
  }
  this->instableLeaveNum = -1;
  this->instableLeave = false;
  if (local_c70.info == 0) {
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x85])
              (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
    (**(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)
              (&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,0xffffffff,&none,0,0);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems[0] = 0;
    t.m_backend.data._M_elems[1] = 0;
    t.m_backend.data._M_elems[2] = 0;
    t.m_backend.data._M_elems[3] = 0;
    t.m_backend.data._M_elems[4] = 0;
    t.m_backend.data._M_elems[5] = 0;
    t.m_backend.data._M_elems[6] = 0;
    t.m_backend.data._M_elems[7] = 0;
    t.m_backend.data._M_elems[8] = 0;
    t.m_backend.data._M_elems[9] = 0;
    t.m_backend.data._M_elems[10] = 0;
    t.m_backend.data._M_elems[0xb] = 0;
    t.m_backend.data._M_elems[0xc] = 0;
    t.m_backend.data._M_elems[0xd] = 0;
    t.m_backend.data._M_elems[0xe] = 0;
    t.m_backend.data._M_elems[0xf] = 0;
    t.m_backend.data._M_elems[0x10] = 0;
    t.m_backend.data._M_elems[0x11] = 0;
    t.m_backend.data._M_elems[0x12] = 0;
    t.m_backend.data._M_elems[0x13] = 0;
    t.m_backend.data._M_elems[0x14] = 0;
    t.m_backend.data._M_elems[0x15] = 0;
    t.m_backend.data._M_elems[0x16] = 0;
    t.m_backend.data._M_elems[0x17] = 0;
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,0.0);
    pcVar31 = (cpp_dec_float<200u,int,void> *)&t;
    puVar37 = (undefined4 *)local_928;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar37 = *(undefined4 *)pcVar31;
      pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
      puVar37 = puVar37 + (ulong)bVar42 * -2 + 1;
    }
    iStack_8b8 = t.m_backend.exp;
    uStack_8b4 = t.m_backend.neg;
    local_8b0._0_4_ = t.m_backend.fpclass;
    local_8b0._4_4_ = t.m_backend.prec_elem;
    if ((char)local_c98 != '\0') {
      return (bool)0;
    }
    pcVar32 = &local_ab8;
    pnVar30 = &local_1b0;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_ab8.exp;
    local_1b0.m_backend.neg = local_ab8.neg;
    local_1b0.m_backend.fpclass = local_ab8.fpclass;
    local_1b0.m_backend.prec_elem = local_ab8.prec_elem;
    pnVar30 = &leaveMax;
    pnVar33 = &local_230;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar33->m_backend).data._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar33 + ((ulong)bVar42 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = leaveMax.m_backend.exp;
    local_230.m_backend.neg = leaveMax.m_backend.neg;
    local_230.m_backend.fpclass = leaveMax.m_backend.fpclass;
    local_230.m_backend.prec_elem = leaveMax.m_backend.prec_elem;
    RVar43 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar16 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_1b0,&local_230,RVar43);
    if (((~bVar16 | bVar2) & 1U) == 0) {
      pnVar11 = (this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = (long)(int)local_c9c;
      this->instableLeaveNum = local_c9c;
      pnVar29 = pnVar11 + lVar22;
      pnVar30 = &this->instableLeaveVal;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
      }
      (this->instableLeaveVal).m_backend.exp = pnVar11[lVar22].m_backend.exp;
      (this->instableLeaveVal).m_backend.neg = pnVar11[lVar22].m_backend.neg;
      iVar15 = pnVar11[lVar22].m_backend.prec_elem;
      (this->instableLeaveVal).m_backend.fpclass = pnVar11[lVar22].m_backend.fpclass;
      (this->instableLeaveVal).m_backend.prec_elem = iVar15;
      reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
      reject_treshold.m_backend.prec_elem = 0x1c;
      reject_treshold.m_backend.data._M_elems[0] = 0;
      reject_treshold.m_backend.data._M_elems[1] = 0;
      reject_treshold.m_backend.data._M_elems[2] = 0;
      reject_treshold.m_backend.data._M_elems[3] = 0;
      reject_treshold.m_backend.data._M_elems[4] = 0;
      reject_treshold.m_backend.data._M_elems[5] = 0;
      reject_treshold.m_backend.data._M_elems[6] = 0;
      reject_treshold.m_backend.data._M_elems[7] = 0;
      reject_treshold.m_backend.data._M_elems[8] = 0;
      reject_treshold.m_backend.data._M_elems[9] = 0;
      reject_treshold.m_backend.data._M_elems[10] = 0;
      reject_treshold.m_backend.data._M_elems[0xb] = 0;
      reject_treshold.m_backend.data._M_elems[0xc] = 0;
      reject_treshold.m_backend.data._M_elems[0xd] = 0;
      reject_treshold.m_backend.data._M_elems[0xe] = 0;
      reject_treshold.m_backend.data._M_elems[0xf] = 0;
      reject_treshold.m_backend.data._M_elems[0x10] = 0;
      reject_treshold.m_backend.data._M_elems[0x11] = 0;
      reject_treshold.m_backend.data._M_elems[0x12] = 0;
      reject_treshold.m_backend.data._M_elems[0x13] = 0;
      reject_treshold.m_backend.data._M_elems[0x14] = 0;
      reject_treshold.m_backend.data._M_elems[0x15] = 0;
      reject_treshold.m_backend.data._M_elems[0x16] = 0;
      reject_treshold.m_backend.data._M_elems[0x17] = 0;
      reject_treshold.m_backend.data._M_elems[0x18] = 0;
      reject_treshold.m_backend.data._M_elems[0x19] = 0;
      reject_treshold.m_backend.data._M_elems._104_5_ = 0;
      reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      reject_treshold.m_backend.exp = 0;
      reject_treshold.m_backend.neg = false;
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t.m_backend,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&reject_treshold.m_backend,&(this->instableLeaveVal).m_backend,&t.m_backend);
      pnVar11 = (this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar32 = &reject_treshold.m_backend;
      pnVar29 = pnVar11 + lVar22;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      pnVar11[lVar22].m_backend.exp = reject_treshold.m_backend.exp;
      pnVar11[lVar22].m_backend.neg = reject_treshold.m_backend.neg;
      pnVar11[lVar22].m_backend.fpclass = reject_treshold.m_backend.fpclass;
      pnVar11[lVar22].m_backend.prec_elem = reject_treshold.m_backend.prec_elem;
      return (bool)1;
    }
    if (1 < (this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).updateCount) {
      pSVar19 = this->spxout;
      if ((pSVar19 != (SPxOut *)0x0) && (4 < (int)pSVar19->m_verbosity)) {
        t.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
        reject_treshold.m_backend.data._M_elems[0] = 5;
        (*pSVar19->_vptr_SPxOut[2])();
        pSVar19 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar19->m_streams[pSVar19->m_verbosity],"ILEAVE01 factorization triggered in ",
                   0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar19->m_streams[pSVar19->m_verbosity],"leave() for feasibility test",0x1c);
        cVar13 = (char)pSVar19->m_streams[pSVar19->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar19->m_streams[pSVar19->m_verbosity] + -0x18) + cVar13)
        ;
        std::ostream::put(cVar13);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x75])(this);
      return (bool)1;
    }
    if (this->recomputedVectors == false) {
      pcVar32 = &local_ab8;
      ptVar34 = &t;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (ptVar34->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
        ptVar34 = (type *)((long)ptVar34 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      t.m_backend.exp = local_ab8.exp;
      t.m_backend.neg = local_ab8.neg;
      t.m_backend.fpclass = local_ab8.fpclass;
      t.m_backend.prec_elem = local_ab8.prec_elem;
      fVar24 = local_ab8.fpclass;
      if ((local_ab8.neg == true) &&
         (t.m_backend.data._M_elems[0] != 0 || fVar24 != cpp_dec_float_finite)) {
        t.m_backend.neg = false;
      }
      leavetol(&reject_treshold,this);
      if (((fVar24 != cpp_dec_float_NaN) && (reject_treshold.m_backend.fpclass != cpp_dec_float_NaN)
          ) && (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&t.m_backend,&reject_treshold.m_backend), iVar17 < 0)) {
        pSVar19 = this->spxout;
        if ((pSVar19 != (SPxOut *)0x0) && (4 < (int)pSVar19->m_verbosity)) {
          t.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
          reject_treshold.m_backend.data._M_elems[0] = 5;
          (*pSVar19->_vptr_SPxOut[2])();
          pSVar19 = soplex::operator<<(this->spxout,
                                       "ILEAVE11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar19->m_streams[pSVar19->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
        }
        computeFrhs(this);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::solve(&this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this->theFrhs);
        computeFtest(this);
        this->recomputedVectors = true;
        return (bool)1;
      }
    }
    pSVar19 = this->spxout;
    if ((pSVar19 != (SPxOut *)0x0) && (4 < (int)pSVar19->m_verbosity)) {
      t.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
      reject_treshold.m_backend.data._M_elems[0] = 5;
      (*pSVar19->_vptr_SPxOut[2])();
      pSVar19 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar19->m_streams[pSVar19->m_verbosity],
                 "ILEAVE02 unboundedness/infeasibility found ",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar19->m_streams[pSVar19->m_verbosity],"in leave()",10);
      cVar13 = (char)pSVar19->m_streams[pSVar19->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar19->m_streams[pSVar19->m_verbosity] + -0x18) + cVar13);
      std::ostream::put(cVar13);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
    }
    if (this->theRep == COLUMN) {
      pcVar32 = &local_ab8;
      pnVar30 = &local_330;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = local_ab8.exp;
      local_330.m_backend.neg = local_ab8.neg;
      local_330.m_backend.fpclass = local_ab8.fpclass;
      local_330.m_backend.prec_elem = local_ab8.prec_elem;
      computeDualfarkas4Col(this,&local_330);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus != INFEASIBLE) {
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = INFEASIBLE;
      }
    }
    else {
      pcVar32 = &local_ab8;
      pnVar30 = &local_2b0;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = local_ab8.exp;
      local_2b0.m_backend.neg = local_ab8.neg;
      local_2b0.m_backend.fpclass = local_ab8.fpclass;
      local_2b0.m_backend.prec_elem = local_ab8.prec_elem;
      computePrimalray4Row(this,&local_2b0);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus != UNBOUNDED) {
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = UNBOUNDED;
      }
    }
    return (bool)0;
  }
  lVar20 = (long)(int)local_c9c;
  if (&local_c70 ==
      &(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).theBaseId.data[lVar20].super_DataKey) {
    (**(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)
              (&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,(ulong)local_c9c,&none,0,0);
    pDVar14 = &(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat;
    if (leaveId.super_DataKey.info < 0) {
      pDVar14 = &(this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat;
    }
    lVar22 = (long)leaveNum;
    if (leaveStat == P_ON_UPPER) {
      pDVar14->data[lVar22] = P_ON_LOWER;
      pVVar27 = &this->theLCbound;
      if (leaveId.super_DataKey.info < 0) {
        pVVar27 = &this->theLRbound;
      }
      pnVar11 = (pVVar27->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar29 = (this->theCoPrhs->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar28 = pnVar11 + lVar22;
      pnVar36 = pnVar29 + lVar20;
      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pnVar36->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (pointer)((long)pnVar28 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      pnVar29[lVar20].m_backend.exp = pnVar11[lVar22].m_backend.exp;
      pnVar29[lVar20].m_backend.neg = pnVar11[lVar22].m_backend.neg;
      iVar15 = pnVar11[lVar22].m_backend.prec_elem;
      pnVar29[lVar20].m_backend.fpclass = pnVar11[lVar22].m_backend.fpclass;
      pnVar29[lVar20].m_backend.prec_elem = iVar15;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,0);
      ::soplex::infinity::__tls_init();
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,
                 (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_005f4010));
      pnVar11 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar31 = (cpp_dec_float<200u,int,void> *)&t;
      pnVar29 = pnVar11 + lVar20;
      for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = *(undefined4 *)pcVar31;
        pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      pnVar11[lVar20].m_backend.exp = t.m_backend.exp;
      pnVar11[lVar20].m_backend.neg = t.m_backend.neg;
      pnVar11[lVar20].m_backend.fpclass = t.m_backend.fpclass;
      pnVar11[lVar20].m_backend.prec_elem = t.m_backend.prec_elem;
    }
    else {
      pDVar14->data[lVar22] = P_ON_UPPER;
      pVVar27 = &this->theUCbound;
      if (leaveId.super_DataKey.info < 0) {
        pVVar27 = &this->theURbound;
      }
      pnVar11 = (pVVar27->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar29 = (this->theCoPrhs->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar28 = pnVar11 + lVar22;
      pnVar36 = pnVar29 + lVar20;
      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pnVar36->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (pointer)((long)pnVar28 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      pnVar29[lVar20].m_backend.exp = pnVar11[lVar22].m_backend.exp;
      pnVar29[lVar20].m_backend.neg = pnVar11[lVar22].m_backend.neg;
      iVar15 = pnVar11[lVar22].m_backend.prec_elem;
      pnVar29[lVar20].m_backend.fpclass = pnVar11[lVar22].m_backend.fpclass;
      pnVar29[lVar20].m_backend.prec_elem = iVar15;
      ::soplex::infinity::__tls_init();
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,*(double *)(in_FS_OFFSET + -8));
      pnVar11 = (this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar31 = (cpp_dec_float<200u,int,void> *)&t;
      pnVar29 = pnVar11 + lVar20;
      for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = *(undefined4 *)pcVar31;
        pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      pnVar11[lVar20].m_backend.exp = t.m_backend.exp;
      pnVar11[lVar20].m_backend.neg = t.m_backend.neg;
      pnVar11[lVar20].m_backend.fpclass = t.m_backend.fpclass;
      pnVar11[lVar20].m_backend.prec_elem = t.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,0);
    }
    pUVar3 = this->theCoPvec;
    pcVar32 = &local_ab8;
    pnVar30 = &pUVar3->theval;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_ab8.exp;
    (pUVar3->theval).m_backend.neg = local_ab8.neg;
    (pUVar3->theval).m_backend.fpclass = local_ab8.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_ab8.prec_elem;
    pUVar3 = this->thePvec;
    pcVar32 = &local_ab8;
    pnVar30 = &pUVar3->theval;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_ab8.exp;
    (pUVar3->theval).m_backend.neg = local_ab8.neg;
    (pUVar3->theval).m_backend.fpclass = local_ab8.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_ab8.prec_elem;
    RVar43 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,RVar43);
    if (((local_ab8.fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_ab8,&t.m_backend), iVar17 < 1)) {
      RVar43 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      enterBound.m_backend.fpclass = cpp_dec_float_finite;
      enterBound.m_backend.prec_elem = 0x1c;
      enterBound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems[0x18] = 0;
      enterBound.m_backend.data._M_elems[0x19] = 0;
      enterBound.m_backend.data._M_elems._104_5_ = 0;
      enterBound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      enterBound.m_backend.exp = 0;
      enterBound.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&enterBound,RVar43);
      pcVar31 = (cpp_dec_float<200u,int,void> *)&enterBound;
      pnVar30 = &reject_treshold;
      for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = *(uint *)pcVar31;
        pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      reject_treshold.m_backend.exp = enterBound.m_backend.exp;
      reject_treshold.m_backend.neg = enterBound.m_backend.neg;
      reject_treshold.m_backend.fpclass = enterBound.m_backend.fpclass;
      reject_treshold.m_backend.prec_elem = enterBound.m_backend.prec_elem;
      if (reject_treshold.m_backend.data._M_elems[0] != 0 ||
          enterBound.m_backend.fpclass != cpp_dec_float_finite) {
        reject_treshold.m_backend.neg = (bool)(enterBound.m_backend.neg ^ 1);
      }
      if (((enterBound.m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_ab8.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_ab8,&reject_treshold.m_backend), iVar17 < 0))
      goto LAB_0050dc9c;
    }
    else {
LAB_0050dc9c:
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x87])(this);
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->theFvec->theval).m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&(this->m_pricingViol).m_backend,
               &(this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend);
    t.m_backend.data._M_elems[0] = 0xffffffff;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)((this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar20),(int *)&t);
  }
  else {
    local_ca8 = &this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    iVar17 = (*(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._vptr_ClassArray[0x7e])(this,&local_c70);
    local_c98 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(extraout_var_00,iVar17);
    pSVar5 = this->solveVector2;
    pSVar6 = this->solveVector3;
    x = &this->theFvec->thedelta;
    local_c80 = lVar20;
    if (pSVar5 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      if (pSVar6 != (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
        pSVar5 = this->solveVector3rhs;
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).factorized == false) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::factorize(local_ca8);
        }
        pSVar9 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).factor;
        (*pSVar9->_vptr_SLinSolver[0x11])(pSVar9,x,pSVar6,local_c98,pSVar5);
        pSVar5 = this->solveVector3;
        if (pSVar5->setupStatus == true) {
          lVar20 = (long)(pSVar5->super_IdxSet).num;
          if (0 < lVar20) {
            uVar25 = lVar20 + 1;
            do {
              piVar10 = (pSVar5->super_IdxSet).idx;
              pnVar11 = (pSVar5->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar17 = piVar10[uVar25 - 2];
              pnVar29 = pnVar11 + iVar17;
              pcVar32 = &t.m_backend;
              for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                (pcVar32->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar42 * -2 + 1) * 4);
                pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4)
                ;
              }
              t.m_backend.exp = pnVar11[iVar17].m_backend.exp;
              t.m_backend.neg = pnVar11[iVar17].m_backend.neg;
              t.m_backend.fpclass = pnVar11[iVar17].m_backend.fpclass;
              t.m_backend.prec_elem = pnVar11[iVar17].m_backend.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&(this->primVec).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[piVar10[uVar25 - 2]].m_backend,
                         &t.m_backend);
              uVar25 = uVar25 - 1;
            } while (1 < uVar25);
          }
        }
        else {
          uVar23 = (uint)((ulong)((long)(this->primVec).
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->primVec).
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 7);
          if (0 < (int)uVar23) {
            uVar26 = (ulong)(uVar23 & 0x7fffffff);
            uVar25 = uVar26 + 1;
            lVar20 = uVar26 << 7;
            do {
              pnVar11 = (pSVar5->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar35 = (uint *)((long)pnVar11[-1].m_backend.data._M_elems + lVar20);
              pcVar32 = &t.m_backend;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pcVar32->data)._M_elems[0] = *puVar35;
                puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
                pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4)
                ;
              }
              t.m_backend.exp = *(int *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar20);
              t.m_backend.neg = *(bool *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar20 + 4U);
              t.m_backend._120_8_ =
                   *(undefined8 *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar20 + 8U);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)(this->primVec).
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                                m_backend.data._M_elems + lVar20),&t.m_backend);
              uVar25 = uVar25 - 1;
              lVar20 = lVar20 + -0x80;
            } while (1 < uVar25);
          }
        }
        goto LAB_0050e162;
      }
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(local_ca8,x,local_c98);
    }
    else {
      pSVar7 = this->solveVector2rhs;
      if (pSVar6 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).factorized == false) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::factorize(local_ca8);
        }
        pSVar9 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).factor;
        (*pSVar9->_vptr_SLinSolver[0x11])(pSVar9,x,pSVar5,local_c98,pSVar7);
      }
      else {
        pSVar8 = this->solveVector3rhs;
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).factorized == false) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::factorize(local_ca8);
        }
        pSVar9 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).factor;
        (*pSVar9->_vptr_SLinSolver[0x13])(pSVar9,x,pSVar5,pSVar6,local_c98,pSVar7,pSVar8);
        pSVar5 = this->solveVector3;
        if (pSVar5->setupStatus == true) {
          lVar20 = (long)(pSVar5->super_IdxSet).num;
          if (0 < lVar20) {
            uVar25 = lVar20 + 1;
            do {
              piVar10 = (pSVar5->super_IdxSet).idx;
              pnVar11 = (pSVar5->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar17 = piVar10[uVar25 - 2];
              pnVar29 = pnVar11 + iVar17;
              pcVar32 = &t.m_backend;
              for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                (pcVar32->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar42 * -2 + 1) * 4);
                pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4)
                ;
              }
              t.m_backend.exp = pnVar11[iVar17].m_backend.exp;
              t.m_backend.neg = pnVar11[iVar17].m_backend.neg;
              t.m_backend.fpclass = pnVar11[iVar17].m_backend.fpclass;
              t.m_backend.prec_elem = pnVar11[iVar17].m_backend.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&(this->primVec).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[piVar10[uVar25 - 2]].m_backend,
                         &t.m_backend);
              uVar25 = uVar25 - 1;
            } while (1 < uVar25);
          }
        }
        else {
          uVar23 = (uint)((ulong)((long)(this->primVec).
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->primVec).
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 7);
          if (0 < (int)uVar23) {
            uVar26 = (ulong)(uVar23 & 0x7fffffff);
            uVar25 = uVar26 + 1;
            lVar20 = uVar26 << 7;
            do {
              pnVar11 = (pSVar5->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar35 = (uint *)((long)pnVar11[-1].m_backend.data._M_elems + lVar20);
              pcVar32 = &t.m_backend;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pcVar32->data)._M_elems[0] = *puVar35;
                puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
                pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4)
                ;
              }
              t.m_backend.exp = *(int *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar20);
              t.m_backend.neg = *(bool *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar20 + 4U);
              t.m_backend._120_8_ =
                   *(undefined8 *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar20 + 8U);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)(this->primVec).
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                                m_backend.data._M_elems + lVar20),&t.m_backend);
              uVar25 = uVar25 - 1;
              lVar20 = lVar20 + -0x80;
            } while (1 < uVar25);
          }
        }
LAB_0050e162:
        this->totalboundflips = this->totalboundflips + this->boundflips;
        lVar20 = local_c80;
      }
    }
    dVar1 = ((this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->s_epsilon_multiplier;
    uVar25 = -(ulong)(dVar1 == 1.0);
    reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
    reject_treshold.m_backend.prec_elem = 0x1c;
    reject_treshold.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems[0x18] = 0;
    reject_treshold.m_backend.data._M_elems[0x19] = 0;
    reject_treshold.m_backend.data._M_elems._104_5_ = 0;
    reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    reject_treshold.m_backend.exp = 0;
    reject_treshold.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&reject_treshold,
               (double)(~uVar25 & (ulong)(dVar1 * 1e-10) | uVar25 & 0x3ddb7cdfd9d7bdbb));
    pnVar11 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_c78 = lVar20 * 0x80;
    iVar17 = pnVar11[lVar20].m_backend.exp;
    bVar16 = pnVar11[lVar20].m_backend.neg;
    uVar12._0_4_ = pnVar11[lVar20].m_backend.fpclass;
    uVar12._4_4_ = pnVar11[lVar20].m_backend.prec_elem;
    uStack_a30 = 0;
    _local_a38 = uVar12;
    memmove(&t,pnVar11 + lVar20,0x70);
    t.m_backend.neg = bVar16;
    if ((bVar16 == true) && (t.m_backend.data._M_elems[0] != 0 || local_a38 != cpp_dec_float_finite)
       ) {
      t.m_backend.neg = false;
    }
    t.m_backend.exp = iVar17;
    t.m_backend._120_8_ = uVar12;
    if (((local_a38 != cpp_dec_float_NaN) &&
        (reject_treshold.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&t.m_backend,&reject_treshold.m_backend), iVar17 < 0)) {
      if (bVar2 == false) {
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clear(&this->theFvec->thedelta);
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x85])
                  (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,local_c98
                  );
        (**(this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._vptr_SPxBasisBase)(local_ca8,0xffffffff,&none,0,0);
        t.m_backend.fpclass = cpp_dec_float_finite;
        t.m_backend.prec_elem = 0x1c;
        t.m_backend.data._M_elems[0] = 0;
        t.m_backend.data._M_elems[1] = 0;
        t.m_backend.data._M_elems[2] = 0;
        t.m_backend.data._M_elems[3] = 0;
        t.m_backend.data._M_elems[4] = 0;
        t.m_backend.data._M_elems[5] = 0;
        t.m_backend.data._M_elems[6] = 0;
        t.m_backend.data._M_elems[7] = 0;
        t.m_backend.data._M_elems[8] = 0;
        t.m_backend.data._M_elems[9] = 0;
        t.m_backend.data._M_elems[10] = 0;
        t.m_backend.data._M_elems[0xb] = 0;
        t.m_backend.data._M_elems[0xc] = 0;
        t.m_backend.data._M_elems[0xd] = 0;
        t.m_backend.data._M_elems[0xe] = 0;
        t.m_backend.data._M_elems[0xf] = 0;
        t.m_backend.data._M_elems[0x10] = 0;
        t.m_backend.data._M_elems[0x11] = 0;
        t.m_backend.data._M_elems[0x12] = 0;
        t.m_backend.data._M_elems[0x13] = 0;
        t.m_backend.data._M_elems[0x14] = 0;
        t.m_backend.data._M_elems[0x15] = 0;
        t.m_backend.data._M_elems[0x16] = 0;
        t.m_backend.data._M_elems[0x17] = 0;
        t.m_backend.data._M_elems[0x18] = 0;
        t.m_backend.data._M_elems[0x19] = 0;
        t.m_backend.data._M_elems._104_5_ = 0;
        t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        t.m_backend.exp = 0;
        t.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&t,0.0);
        pcVar31 = (cpp_dec_float<200u,int,void> *)&t;
        puVar37 = (undefined4 *)local_928;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar37 = *(undefined4 *)pcVar31;
          pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
          puVar37 = puVar37 + (ulong)bVar42 * -2 + 1;
        }
        iStack_8b8 = t.m_backend.exp;
        uStack_8b4 = t.m_backend.neg;
        local_8b0._0_4_ = t.m_backend.fpclass;
        local_8b0._4_4_ = t.m_backend.prec_elem;
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(((this->theCoTest).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  local_c78);
        t.m_backend.fpclass = cpp_dec_float_finite;
        t.m_backend.prec_elem = 0x1c;
        t.m_backend.data._M_elems[0] = 0;
        t.m_backend.data._M_elems[1] = 0;
        t.m_backend.data._M_elems[2] = 0;
        t.m_backend.data._M_elems[3] = 0;
        t.m_backend.data._M_elems[4] = 0;
        t.m_backend.data._M_elems[5] = 0;
        t.m_backend.data._M_elems[6] = 0;
        t.m_backend.data._M_elems[7] = 0;
        t.m_backend.data._M_elems[8] = 0;
        t.m_backend.data._M_elems[9] = 0;
        t.m_backend.data._M_elems[10] = 0;
        t.m_backend.data._M_elems[0xb] = 0;
        t.m_backend.data._M_elems[0xc] = 0;
        t.m_backend.data._M_elems[0xd] = 0;
        t.m_backend.data._M_elems[0xe] = 0;
        t.m_backend.data._M_elems[0xf] = 0;
        t.m_backend.data._M_elems[0x10] = 0;
        t.m_backend.data._M_elems[0x11] = 0;
        t.m_backend.data._M_elems[0x12] = 0;
        t.m_backend.data._M_elems[0x13] = 0;
        t.m_backend.data._M_elems[0x14] = 0;
        t.m_backend.data._M_elems[0x15] = 0;
        t.m_backend.data._M_elems[0x16] = 0;
        t.m_backend.data._M_elems[0x17] = 0;
        t.m_backend.data._M_elems[0x18] = 0;
        t.m_backend.data._M_elems[0x19] = 0;
        t.m_backend.data._M_elems._104_5_ = 0;
        t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        t.m_backend.exp = 0;
        t.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&t.m_backend,0.01);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (pcVar32,&t.m_backend);
      }
      else {
        pSVar19 = this->spxout;
        if ((pSVar19 != (SPxOut *)0x0) && (4 < (int)pSVar19->m_verbosity)) {
          t.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
          enterBound.m_backend.data._M_elems[0] = 5;
          (*pSVar19->_vptr_SPxOut[2])();
          pSVar19 = this->spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar19->m_streams[pSVar19->m_verbosity],
                     "ILEAVE03 unboundedness/infeasibility found ",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar19->m_streams[pSVar19->m_verbosity],"in leave()",10);
          cVar13 = (char)pSVar19->m_streams[pSVar19->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar19->m_streams[pSVar19->m_verbosity] + -0x18) +
                          cVar13);
          std::ostream::put(cVar13);
          std::ostream::flush();
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x85])
                  (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
        (**(this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._vptr_SPxBasisBase)(local_ca8,0xffffffff,&none,0,0);
        t.m_backend.fpclass = cpp_dec_float_finite;
        t.m_backend.prec_elem = 0x1c;
        t.m_backend.data._M_elems[0] = 0;
        t.m_backend.data._M_elems[1] = 0;
        t.m_backend.data._M_elems[2] = 0;
        t.m_backend.data._M_elems[3] = 0;
        t.m_backend.data._M_elems[4] = 0;
        t.m_backend.data._M_elems[5] = 0;
        t.m_backend.data._M_elems[6] = 0;
        t.m_backend.data._M_elems[7] = 0;
        t.m_backend.data._M_elems[8] = 0;
        t.m_backend.data._M_elems[9] = 0;
        t.m_backend.data._M_elems[10] = 0;
        t.m_backend.data._M_elems[0xb] = 0;
        t.m_backend.data._M_elems[0xc] = 0;
        t.m_backend.data._M_elems[0xd] = 0;
        t.m_backend.data._M_elems[0xe] = 0;
        t.m_backend.data._M_elems[0xf] = 0;
        t.m_backend.data._M_elems[0x10] = 0;
        t.m_backend.data._M_elems[0x11] = 0;
        t.m_backend.data._M_elems[0x12] = 0;
        t.m_backend.data._M_elems[0x13] = 0;
        t.m_backend.data._M_elems[0x14] = 0;
        t.m_backend.data._M_elems[0x15] = 0;
        t.m_backend.data._M_elems[0x16] = 0;
        t.m_backend.data._M_elems[0x17] = 0;
        t.m_backend.data._M_elems[0x18] = 0;
        t.m_backend.data._M_elems[0x19] = 0;
        t.m_backend.data._M_elems._104_5_ = 0;
        t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        t.m_backend.exp = 0;
        t.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&t,0.0);
        pcVar31 = (cpp_dec_float<200u,int,void> *)&t;
        puVar37 = (undefined4 *)local_928;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar37 = *(undefined4 *)pcVar31;
          pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
          puVar37 = puVar37 + (ulong)bVar42 * -2 + 1;
        }
        iStack_8b8 = t.m_backend.exp;
        uStack_8b4 = t.m_backend.neg;
        local_8b0._0_4_ = t.m_backend.fpclass;
        local_8b0._4_4_ = t.m_backend.prec_elem;
        if (this->theRep == ROW) {
          pcVar32 = &local_ab8;
          pnVar30 = &local_3b0;
          for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
            (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
            pcVar32 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
            pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
          }
          local_3b0.m_backend.exp = local_ab8.exp;
          local_3b0.m_backend.neg = local_ab8.neg;
          local_3b0.m_backend.fpclass = local_ab8.fpclass;
          local_3b0.m_backend.prec_elem = local_ab8.prec_elem;
          computePrimalray4Row(this,&local_3b0);
          if (this->m_status == OPTIMAL) {
            this->m_status = UNKNOWN;
          }
          if ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thestatus != UNBOUNDED) {
            (this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus = UNBOUNDED;
          }
        }
        else {
          pcVar32 = &local_ab8;
          pnVar30 = &local_430;
          for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
            (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
            pcVar32 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
            pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
          }
          local_430.m_backend.exp = local_ab8.exp;
          local_430.m_backend.neg = local_ab8.neg;
          local_430.m_backend.fpclass = local_ab8.fpclass;
          local_430.m_backend.prec_elem = local_ab8.prec_elem;
          computeDualfarkas4Col(this,&local_430);
          if (this->m_status == OPTIMAL) {
            this->m_status = UNKNOWN;
          }
          if ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thestatus != INFEASIBLE) {
            (this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus = INFEASIBLE;
          }
        }
      }
      return (bool)(bVar2 ^ 1);
    }
    RVar43 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t.m_backend,RVar43);
    if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
        (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&leavebound.m_backend,&t.m_backend), iVar17 < 1)) {
      RVar43 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      newUBbound.m_backend.fpclass = cpp_dec_float_finite;
      newUBbound.m_backend.prec_elem = 0x1c;
      newUBbound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      newUBbound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      newUBbound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      newUBbound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      newUBbound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      newUBbound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      newUBbound.m_backend.data._M_elems[0x18] = 0;
      newUBbound.m_backend.data._M_elems[0x19] = 0;
      newUBbound.m_backend.data._M_elems._104_5_ = 0;
      newUBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      newUBbound.m_backend.exp = 0;
      newUBbound.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&newUBbound,RVar43);
      pcVar31 = (cpp_dec_float<200u,int,void> *)&newUBbound;
      pnVar30 = &enterBound;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = *(uint *)pcVar31;
        pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      enterBound.m_backend.exp = newUBbound.m_backend.exp;
      enterBound.m_backend.neg = newUBbound.m_backend.neg;
      enterBound.m_backend.fpclass = newUBbound.m_backend.fpclass;
      enterBound.m_backend.prec_elem = newUBbound.m_backend.prec_elem;
      if (enterBound.m_backend.data._M_elems[0] != 0 ||
          newUBbound.m_backend.fpclass != cpp_dec_float_finite) {
        enterBound.m_backend.neg = (bool)(newUBbound.m_backend.neg ^ 1);
      }
      if (((newUBbound.m_backend.fpclass != cpp_dec_float_NaN) &&
          (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&leavebound.m_backend,&enterBound.m_backend), iVar17 < 0))
      goto LAB_0050e5c8;
    }
    else {
LAB_0050e5c8:
      pVVar27 = this->theFrhs;
      pnVar30 = &leavebound;
      pcVar32 = &enterBound.m_backend;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar32->data)->data)._M_elems[0] =
             (pnVar30->m_backend).data._M_elems[0];
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
      }
      enterBound.m_backend.exp = leavebound.m_backend.exp;
      enterBound.m_backend.neg = leavebound.m_backend.neg;
      enterBound.m_backend.fpclass = leavebound.m_backend.fpclass;
      enterBound.m_backend.prec_elem = leavebound.m_backend.prec_elem;
      if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
          enterBound.m_backend.data._M_elems[0] != 0) {
        enterBound.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
      }
      pSVar41 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).matrix.data[local_c80];
      lVar20 = (long)pSVar41->memused;
      if (0 < lVar20) {
        uVar25 = lVar20 + 1;
        lVar20 = lVar20 * 0x84;
        do {
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)pSVar41->m_elem[-1].val.m_backend.data._M_elems + lVar20);
          t.m_backend.fpclass = cpp_dec_float_finite;
          t.m_backend.prec_elem = 0x1c;
          t.m_backend.data._M_elems[0] = 0;
          t.m_backend.data._M_elems[1] = 0;
          t.m_backend.data._M_elems[2] = 0;
          t.m_backend.data._M_elems[3] = 0;
          t.m_backend.data._M_elems[4] = 0;
          t.m_backend.data._M_elems[5] = 0;
          t.m_backend.data._M_elems[6] = 0;
          t.m_backend.data._M_elems[7] = 0;
          t.m_backend.data._M_elems[8] = 0;
          t.m_backend.data._M_elems[9] = 0;
          t.m_backend.data._M_elems[10] = 0;
          t.m_backend.data._M_elems[0xb] = 0;
          t.m_backend.data._M_elems[0xc] = 0;
          t.m_backend.data._M_elems[0xd] = 0;
          t.m_backend.data._M_elems[0xe] = 0;
          t.m_backend.data._M_elems[0xf] = 0;
          t.m_backend.data._M_elems[0x10] = 0;
          t.m_backend.data._M_elems[0x11] = 0;
          t.m_backend.data._M_elems[0x12] = 0;
          t.m_backend.data._M_elems[0x13] = 0;
          t.m_backend.data._M_elems[0x14] = 0;
          t.m_backend.data._M_elems[0x15] = 0;
          t.m_backend.data._M_elems[0x16] = 0;
          t.m_backend.data._M_elems[0x17] = 0;
          t.m_backend.data._M_elems[0x18] = 0;
          t.m_backend.data._M_elems[0x19] = 0;
          t.m_backend.data._M_elems._104_5_ = 0;
          t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          t.m_backend.exp = 0;
          t.m_backend.neg = false;
          pcVar32 = &enterBound.m_backend;
          if (pcVar18 != &t.m_backend) {
            pcVar38 = &t.m_backend;
            for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
              (pcVar38->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar32->data)->data)._M_elems[0];
              pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar42 * -8 + 4);
            }
            t.m_backend.exp = enterBound.m_backend.exp;
            t.m_backend.neg = enterBound.m_backend.neg;
            t.m_backend.fpclass = enterBound.m_backend.fpclass;
            t.m_backend.prec_elem = enterBound.m_backend.prec_elem;
            pcVar32 = pcVar18;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&t.m_backend,pcVar32);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&(pVVar27->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)(&pSVar41->m_elem[-1].val + 1) + lVar20)].m_backend,
                     &t.m_backend);
          uVar25 = uVar25 - 1;
          lVar20 = lVar20 + -0x84;
        } while (1 < uVar25);
      }
    }
    enterBound.m_backend.fpclass = cpp_dec_float_finite;
    enterBound.m_backend.prec_elem = 0x1c;
    enterBound.m_backend.data._M_elems[0] = 0;
    enterBound.m_backend.data._M_elems[1] = 0;
    enterBound.m_backend.data._M_elems[2] = 0;
    enterBound.m_backend.data._M_elems[3] = 0;
    enterBound.m_backend.data._M_elems[4] = 0;
    enterBound.m_backend.data._M_elems[5] = 0;
    enterBound.m_backend.data._M_elems[6] = 0;
    enterBound.m_backend.data._M_elems[7] = 0;
    enterBound.m_backend.data._M_elems[8] = 0;
    enterBound.m_backend.data._M_elems[9] = 0;
    enterBound.m_backend.data._M_elems[10] = 0;
    enterBound.m_backend.data._M_elems[0xb] = 0;
    enterBound.m_backend.data._M_elems[0xc] = 0;
    enterBound.m_backend.data._M_elems[0xd] = 0;
    enterBound.m_backend.data._M_elems[0xe] = 0;
    enterBound.m_backend.data._M_elems[0xf] = 0;
    enterBound.m_backend.data._M_elems[0x10] = 0;
    enterBound.m_backend.data._M_elems[0x11] = 0;
    enterBound.m_backend.data._M_elems[0x12] = 0;
    enterBound.m_backend.data._M_elems[0x13] = 0;
    enterBound.m_backend.data._M_elems[0x14] = 0;
    enterBound.m_backend.data._M_elems[0x15] = 0;
    enterBound.m_backend.data._M_elems[0x16] = 0;
    enterBound.m_backend.data._M_elems[0x17] = 0;
    enterBound.m_backend.data._M_elems[0x18] = 0;
    enterBound.m_backend.data._M_elems[0x19] = 0;
    enterBound.m_backend.data._M_elems._104_5_ = 0;
    enterBound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    enterBound.m_backend.exp = 0;
    enterBound.m_backend.neg = false;
    newUBbound.m_backend.fpclass = cpp_dec_float_finite;
    newUBbound.m_backend.prec_elem = 0x1c;
    newUBbound.m_backend.data._M_elems[0] = 0;
    newUBbound.m_backend.data._M_elems[1] = 0;
    newUBbound.m_backend.data._M_elems[2] = 0;
    newUBbound.m_backend.data._M_elems[3] = 0;
    newUBbound.m_backend.data._M_elems[4] = 0;
    newUBbound.m_backend.data._M_elems[5] = 0;
    newUBbound.m_backend.data._M_elems[6] = 0;
    newUBbound.m_backend.data._M_elems[7] = 0;
    newUBbound.m_backend.data._M_elems[8] = 0;
    newUBbound.m_backend.data._M_elems[9] = 0;
    newUBbound.m_backend.data._M_elems[10] = 0;
    newUBbound.m_backend.data._M_elems[0xb] = 0;
    newUBbound.m_backend.data._M_elems[0xc] = 0;
    newUBbound.m_backend.data._M_elems[0xd] = 0;
    newUBbound.m_backend.data._M_elems[0xe] = 0;
    newUBbound.m_backend.data._M_elems[0xf] = 0;
    newUBbound.m_backend.data._M_elems[0x10] = 0;
    newUBbound.m_backend.data._M_elems[0x11] = 0;
    newUBbound.m_backend.data._M_elems[0x12] = 0;
    newUBbound.m_backend.data._M_elems[0x13] = 0;
    newUBbound.m_backend.data._M_elems[0x14] = 0;
    newUBbound.m_backend.data._M_elems[0x15] = 0;
    newUBbound.m_backend.data._M_elems[0x16] = 0;
    newUBbound.m_backend.data._M_elems[0x17] = 0;
    newUBbound.m_backend.data._M_elems[0x18] = 0;
    newUBbound.m_backend.data._M_elems[0x19] = 0;
    newUBbound.m_backend.data._M_elems._104_5_ = 0;
    newUBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    newUBbound.m_backend.exp = 0;
    newUBbound.m_backend.neg = false;
    newLBbound.m_backend.fpclass = cpp_dec_float_finite;
    newLBbound.m_backend.prec_elem = 0x1c;
    newLBbound.m_backend.data._M_elems[0] = 0;
    newLBbound.m_backend.data._M_elems[1] = 0;
    newLBbound.m_backend.data._M_elems[2] = 0;
    newLBbound.m_backend.data._M_elems[3] = 0;
    newLBbound.m_backend.data._M_elems[4] = 0;
    newLBbound.m_backend.data._M_elems[5] = 0;
    newLBbound.m_backend.data._M_elems[6] = 0;
    newLBbound.m_backend.data._M_elems[7] = 0;
    newLBbound.m_backend.data._M_elems[8] = 0;
    newLBbound.m_backend.data._M_elems[9] = 0;
    newLBbound.m_backend.data._M_elems[10] = 0;
    newLBbound.m_backend.data._M_elems[0xb] = 0;
    newLBbound.m_backend.data._M_elems[0xc] = 0;
    newLBbound.m_backend.data._M_elems[0xd] = 0;
    newLBbound.m_backend.data._M_elems[0xe] = 0;
    newLBbound.m_backend.data._M_elems[0xf] = 0;
    newLBbound.m_backend.data._M_elems[0x10] = 0;
    newLBbound.m_backend.data._M_elems[0x11] = 0;
    newLBbound.m_backend.data._M_elems[0x12] = 0;
    newLBbound.m_backend.data._M_elems[0x13] = 0;
    newLBbound.m_backend.data._M_elems[0x14] = 0;
    newLBbound.m_backend.data._M_elems[0x15] = 0;
    newLBbound.m_backend.data._M_elems[0x16] = 0;
    newLBbound.m_backend.data._M_elems[0x17] = 0;
    newLBbound.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
    newLBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    newLBbound.m_backend.exp = 0;
    newLBbound.m_backend.neg = false;
    newCoPrhs.m_backend.fpclass = cpp_dec_float_finite;
    newCoPrhs.m_backend.prec_elem = 0x1c;
    newCoPrhs.m_backend.data._M_elems[0] = 0;
    newCoPrhs.m_backend.data._M_elems[1] = 0;
    newCoPrhs.m_backend.data._M_elems[2] = 0;
    newCoPrhs.m_backend.data._M_elems[3] = 0;
    newCoPrhs.m_backend.data._M_elems[4] = 0;
    newCoPrhs.m_backend.data._M_elems[5] = 0;
    newCoPrhs.m_backend.data._M_elems[6] = 0;
    newCoPrhs.m_backend.data._M_elems[7] = 0;
    newCoPrhs.m_backend.data._M_elems[8] = 0;
    newCoPrhs.m_backend.data._M_elems[9] = 0;
    newCoPrhs.m_backend.data._M_elems[10] = 0;
    newCoPrhs.m_backend.data._M_elems[0xb] = 0;
    newCoPrhs.m_backend.data._M_elems[0xc] = 0;
    newCoPrhs.m_backend.data._M_elems[0xd] = 0;
    newCoPrhs.m_backend.data._M_elems[0xe] = 0;
    newCoPrhs.m_backend.data._M_elems[0xf] = 0;
    newCoPrhs.m_backend.data._M_elems[0x10] = 0;
    newCoPrhs.m_backend.data._M_elems[0x11] = 0;
    newCoPrhs.m_backend.data._M_elems[0x12] = 0;
    newCoPrhs.m_backend.data._M_elems[0x13] = 0;
    newCoPrhs.m_backend.data._M_elems[0x14] = 0;
    newCoPrhs.m_backend.data._M_elems[0x15] = 0;
    newCoPrhs.m_backend.data._M_elems[0x16] = 0;
    newCoPrhs.m_backend.data._M_elems[0x17] = 0;
    newCoPrhs.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
    newCoPrhs.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    newCoPrhs.m_backend.exp = 0;
    newCoPrhs.m_backend.neg = false;
    pnVar30 = &leaveMax;
    puVar35 = local_4b0;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar35 = (pnVar30->m_backend).data._M_elems[0];
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
    }
    local_440 = leaveMax.m_backend.exp;
    local_43c = leaveMax.m_backend.neg;
    local_438 = leaveMax.m_backend.fpclass;
    iStack_434 = leaveMax.m_backend.prec_elem;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x80])
              (this,local_4b0,local_c70,&enterBound.m_backend,&newUBbound,&newLBbound,&newCoPrhs,
               local_928);
    pnVar11 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar30 = &newUBbound;
    puVar35 = (uint *)((long)(pnVar11->m_backend).data._M_elems + local_c78);
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar35 = (pnVar30->m_backend).data._M_elems[0];
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
    }
    *(int *)((long)(&(pnVar11->m_backend).data + 1) + local_c78) = newUBbound.m_backend.exp;
    *(bool *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 4U) = newUBbound.m_backend.neg;
    *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 8U) =
         newUBbound.m_backend._120_8_;
    pnVar11 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar30 = &newLBbound;
    puVar35 = (uint *)((long)(pnVar11->m_backend).data._M_elems + local_c78);
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar35 = (pnVar30->m_backend).data._M_elems[0];
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
    }
    *(int *)((long)(&(pnVar11->m_backend).data + 1) + local_c78) = newLBbound.m_backend.exp;
    *(bool *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 4U) = newLBbound.m_backend.neg;
    *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 8U) =
         newLBbound.m_backend._120_8_;
    pnVar11 = (this->theCoPrhs->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar30 = &newCoPrhs;
    puVar35 = (uint *)((long)(pnVar11->m_backend).data._M_elems + local_c78);
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar35 = (pnVar30->m_backend).data._M_elems[0];
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
    }
    *(int *)((long)(&(pnVar11->m_backend).data + 1) + local_c78) = newCoPrhs.m_backend.exp;
    *(bool *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 4U) = newCoPrhs.m_backend.neg;
    *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 8U) =
         newCoPrhs.m_backend._120_8_;
    RVar43 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t.m_backend,RVar43);
    if (((enterBound.m_backend.fpclass == cpp_dec_float_NaN) ||
        (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&enterBound.m_backend,&t.m_backend), iVar17 < 1)) {
      RVar43 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 0x1c;
      result_7.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems[0x18] = 0;
      result_7.m_backend.data._M_elems[0x19] = 0;
      result_7.m_backend.data._M_elems._104_5_ = 0;
      result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_7,RVar43);
      pcVar31 = (cpp_dec_float<200u,int,void> *)&result_7;
      pnVar30 = &result_4;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = *(uint *)pcVar31;
        pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      result_4.m_backend.exp = result_7.m_backend.exp;
      result_4.m_backend.neg = result_7.m_backend.neg;
      result_4.m_backend.fpclass = result_7.m_backend.fpclass;
      result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
      if (result_4.m_backend.data._M_elems[0] != 0 ||
          result_7.m_backend.fpclass != cpp_dec_float_finite) {
        result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
      }
      if (((result_7.m_backend.fpclass != cpp_dec_float_NaN) &&
          (enterBound.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&enterBound.m_backend,&result_4.m_backend), iVar17 < 0))
      goto LAB_0050ea70;
    }
    else {
LAB_0050ea70:
      lVar20 = (long)local_c98->memused;
      if (0 < lVar20) {
        pVVar27 = this->theFrhs;
        uVar25 = lVar20 + 1;
        pSVar41 = local_c98;
        lVar20 = lVar20 * 0x84;
        do {
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)pSVar41->m_elem[-1].val.m_backend.data._M_elems + lVar20);
          t.m_backend.fpclass = cpp_dec_float_finite;
          t.m_backend.prec_elem = 0x1c;
          t.m_backend.data._M_elems[0] = 0;
          t.m_backend.data._M_elems[1] = 0;
          t.m_backend.data._M_elems[2] = 0;
          t.m_backend.data._M_elems[3] = 0;
          t.m_backend.data._M_elems[4] = 0;
          t.m_backend.data._M_elems[5] = 0;
          t.m_backend.data._M_elems[6] = 0;
          t.m_backend.data._M_elems[7] = 0;
          t.m_backend.data._M_elems[8] = 0;
          t.m_backend.data._M_elems[9] = 0;
          t.m_backend.data._M_elems[10] = 0;
          t.m_backend.data._M_elems[0xb] = 0;
          t.m_backend.data._M_elems[0xc] = 0;
          t.m_backend.data._M_elems[0xd] = 0;
          t.m_backend.data._M_elems[0xe] = 0;
          t.m_backend.data._M_elems[0xf] = 0;
          t.m_backend.data._M_elems[0x10] = 0;
          t.m_backend.data._M_elems[0x11] = 0;
          t.m_backend.data._M_elems[0x12] = 0;
          t.m_backend.data._M_elems[0x13] = 0;
          t.m_backend.data._M_elems[0x14] = 0;
          t.m_backend.data._M_elems[0x15] = 0;
          t.m_backend.data._M_elems[0x16] = 0;
          t.m_backend.data._M_elems[0x17] = 0;
          t.m_backend.data._M_elems[0x18] = 0;
          t.m_backend.data._M_elems[0x19] = 0;
          t.m_backend.data._M_elems._104_5_ = 0;
          t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          t.m_backend.exp = 0;
          t.m_backend.neg = false;
          pcVar32 = &enterBound.m_backend;
          if (pcVar18 != &t.m_backend) {
            pcVar38 = &t.m_backend;
            for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
              (pcVar38->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar32->data)->data)._M_elems[0];
              pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar42 * -8 + 4);
            }
            t.m_backend.exp = enterBound.m_backend.exp;
            t.m_backend.neg = enterBound.m_backend.neg;
            t.m_backend.fpclass = enterBound.m_backend.fpclass;
            t.m_backend.prec_elem = enterBound.m_backend.prec_elem;
            pcVar32 = pcVar18;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&t.m_backend,pcVar32);
          pSVar41 = local_c98;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&(pVVar27->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)(&local_c98->m_elem[-1].val + 1) + lVar20)].m_backend,
                     &t.m_backend);
          uVar25 = uVar25 - 1;
          lVar20 = lVar20 + -0x84;
        } while (1 < uVar25);
      }
    }
    pUVar3 = this->theCoPvec;
    pcVar32 = &local_ab8;
    pnVar30 = &pUVar3->theval;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_ab8.exp;
    (pUVar3->theval).m_backend.neg = local_ab8.neg;
    (pUVar3->theval).m_backend.fpclass = local_ab8.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_ab8.prec_elem;
    pUVar3 = this->thePvec;
    pcVar32 = &local_ab8;
    pnVar30 = &pUVar3->theval;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_ab8.exp;
    (pUVar3->theval).m_backend.neg = local_ab8.neg;
    (pUVar3->theval).m_backend.fpclass = local_ab8.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_ab8.prec_elem;
    RVar43 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,RVar43);
    if (((local_ab8.fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_ab8,&t.m_backend), pSVar40 = local_ca8, uVar23 = local_c9c,
       iVar17 < 1)) {
      uVar23 = local_c9c;
      pSVar40 = local_ca8;
      RVar43 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 0x1c;
      result_7.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_7.m_backend.data._M_elems[0x18] = 0;
      result_7.m_backend.data._M_elems[0x19] = 0;
      result_7.m_backend.data._M_elems._104_5_ = 0;
      result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_7,RVar43);
      pcVar31 = (cpp_dec_float<200u,int,void> *)&result_7;
      pnVar30 = &result_4;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar30->m_backend).data._M_elems[0] = *(uint *)pcVar31;
        pcVar31 = pcVar31 + (ulong)bVar42 * -8 + 4;
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      result_4.m_backend.exp = result_7.m_backend.exp;
      result_4.m_backend.neg = result_7.m_backend.neg;
      result_4.m_backend.fpclass = result_7.m_backend.fpclass;
      result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
      if (result_4.m_backend.data._M_elems[0] != 0 ||
          result_7.m_backend.fpclass != cpp_dec_float_finite) {
        result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
      }
      if (((result_7.m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_ab8.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_ab8,&result_4.m_backend), iVar17 < 0)) goto LAB_0050ed43;
    }
    else {
LAB_0050ed43:
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x87])(this);
    }
    pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)(((this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 local_c78);
    result_7.m_backend.fpclass = cpp_dec_float_finite;
    result_7.m_backend.prec_elem = 0x1c;
    result_7.m_backend.data._M_elems[0] = 0;
    result_7.m_backend.data._M_elems[1] = 0;
    result_7.m_backend.data._M_elems[2] = 0;
    result_7.m_backend.data._M_elems[3] = 0;
    result_7.m_backend.data._M_elems[4] = 0;
    result_7.m_backend.data._M_elems[5] = 0;
    result_7.m_backend.data._M_elems[6] = 0;
    result_7.m_backend.data._M_elems[7] = 0;
    result_7.m_backend.data._M_elems[8] = 0;
    result_7.m_backend.data._M_elems[9] = 0;
    result_7.m_backend.data._M_elems[10] = 0;
    result_7.m_backend.data._M_elems[0xb] = 0;
    result_7.m_backend.data._M_elems[0xc] = 0;
    result_7.m_backend.data._M_elems[0xd] = 0;
    result_7.m_backend.data._M_elems[0xe] = 0;
    result_7.m_backend.data._M_elems[0xf] = 0;
    result_7.m_backend.data._M_elems[0x10] = 0;
    result_7.m_backend.data._M_elems[0x11] = 0;
    result_7.m_backend.data._M_elems[0x12] = 0;
    result_7.m_backend.data._M_elems[0x13] = 0;
    result_7.m_backend.data._M_elems[0x14] = 0;
    result_7.m_backend.data._M_elems[0x15] = 0;
    result_7.m_backend.data._M_elems[0x16] = 0;
    result_7.m_backend.data._M_elems[0x17] = 0;
    result_7.m_backend.data._M_elems[0x18] = 0;
    result_7.m_backend.data._M_elems[0x19] = 0;
    result_7.m_backend.data._M_elems._104_5_ = 0;
    result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_7.m_backend.exp = 0;
    result_7.m_backend.neg = false;
    if (&result_7 != pnVar30) {
      pnVar33 = pnVar30;
      pnVar39 = &result_7;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pnVar39->m_backend).data._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
        pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar33 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar39 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      result_7.m_backend.exp = (pnVar30->m_backend).exp;
      result_7.m_backend.neg = (pnVar30->m_backend).neg;
      result_7.m_backend.fpclass = (pnVar30->m_backend).fpclass;
      result_7.m_backend.prec_elem = (pnVar30->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&result_7.m_backend,&leavebound.m_backend);
    pcVar32 = &result_7.m_backend;
    pnVar30 = &result_4;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
    }
    result_4.m_backend.exp = result_7.m_backend.exp;
    result_4.m_backend.neg = result_7.m_backend.neg;
    result_4.m_backend.fpclass = result_7.m_backend.fpclass;
    result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
    if (result_7.m_backend.fpclass != cpp_dec_float_finite ||
        result_4.m_backend.data._M_elems[0] != 0) {
      result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
    }
    pnVar11 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar35 = (uint *)((long)(pnVar11->m_backend).data._M_elems + local_c78);
    pcVar32 = &local_530;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pcVar32->data)._M_elems[0] = *puVar35;
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
    }
    local_530.exp = *(int *)((long)(&(pnVar11->m_backend).data + 1) + local_c78);
    local_530.neg = *(bool *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 4U);
    local_530._120_8_ = *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 8U);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems[0] = 0;
    t.m_backend.data._M_elems[1] = 0;
    t.m_backend.data._M_elems[2] = 0;
    t.m_backend.data._M_elems[3] = 0;
    t.m_backend.data._M_elems[4] = 0;
    t.m_backend.data._M_elems[5] = 0;
    t.m_backend.data._M_elems[6] = 0;
    t.m_backend.data._M_elems[7] = 0;
    t.m_backend.data._M_elems[8] = 0;
    t.m_backend.data._M_elems[9] = 0;
    t.m_backend.data._M_elems[10] = 0;
    t.m_backend.data._M_elems[0xb] = 0;
    t.m_backend.data._M_elems[0xc] = 0;
    t.m_backend.data._M_elems[0xd] = 0;
    t.m_backend.data._M_elems[0xe] = 0;
    t.m_backend.data._M_elems[0xf] = 0;
    t.m_backend.data._M_elems[0x10] = 0;
    t.m_backend.data._M_elems[0x11] = 0;
    t.m_backend.data._M_elems[0x12] = 0;
    t.m_backend.data._M_elems[0x13] = 0;
    t.m_backend.data._M_elems[0x14] = 0;
    t.m_backend.data._M_elems[0x15] = 0;
    t.m_backend.data._M_elems[0x16] = 0;
    t.m_backend.data._M_elems[0x17] = 0;
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&t.m_backend,&result_4.m_backend,&local_530);
    pUVar3 = this->theFvec;
    pcVar32 = &t.m_backend;
    pnVar30 = &pUVar3->theval;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = (pcVar32->data)._M_elems[0];
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + (ulong)bVar42 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = t.m_backend.exp;
    (pUVar3->theval).m_backend.neg = t.m_backend.neg;
    (pUVar3->theval).m_backend.fpclass = t.m_backend.fpclass;
    (pUVar3->theval).m_backend.prec_elem = t.m_backend.prec_elem;
    pUVar3 = this->theFvec;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)pUVar3,&pUVar3->theval,&pUVar3->thedelta);
    pnVar30 = &this->theFvec->theval;
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems[0] = 0;
    t.m_backend.data._M_elems[1] = 0;
    t.m_backend.data._M_elems[2] = 0;
    t.m_backend.data._M_elems[3] = 0;
    t.m_backend.data._M_elems[4] = 0;
    t.m_backend.data._M_elems[5] = 0;
    t.m_backend.data._M_elems[6] = 0;
    t.m_backend.data._M_elems[7] = 0;
    t.m_backend.data._M_elems[8] = 0;
    t.m_backend.data._M_elems[9] = 0;
    t.m_backend.data._M_elems[10] = 0;
    t.m_backend.data._M_elems[0xb] = 0;
    t.m_backend.data._M_elems[0xc] = 0;
    t.m_backend.data._M_elems[0xd] = 0;
    t.m_backend.data._M_elems[0xe] = 0;
    t.m_backend.data._M_elems[0xf] = 0;
    t.m_backend.data._M_elems[0x10] = 0;
    t.m_backend.data._M_elems[0x11] = 0;
    t.m_backend.data._M_elems[0x12] = 0;
    t.m_backend.data._M_elems[0x13] = 0;
    t.m_backend.data._M_elems[0x14] = 0;
    t.m_backend.data._M_elems[0x15] = 0;
    t.m_backend.data._M_elems[0x16] = 0;
    t.m_backend.data._M_elems[0x17] = 0;
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    if (&t.m_backend == &pnVar30->m_backend) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&t.m_backend,&enterBound.m_backend);
      if (t.m_backend.data._M_elems[0] != 0 || t.m_backend.fpclass != cpp_dec_float_finite) {
        t.m_backend.neg = (bool)(t.m_backend.neg ^ 1);
      }
    }
    else {
      pnVar33 = &enterBound;
      pcVar32 = &t.m_backend;
      for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pcVar32->data)._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
        pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar33 + ((ulong)bVar42 * -2 + 1) * 4);
        pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar42 * -8 + 4);
      }
      t.m_backend.exp = enterBound.m_backend.exp;
      t.m_backend.neg = enterBound.m_backend.neg;
      t.m_backend.fpclass = enterBound.m_backend.fpclass;
      t.m_backend.prec_elem = enterBound.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&t.m_backend,&pnVar30->m_backend);
    }
    lVar20 = local_c80;
    pnVar11 = (this->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ptVar34 = &t;
    puVar35 = (uint *)((long)(pnVar11->m_backend).data._M_elems + local_c78);
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar35 = (ptVar34->m_backend).data._M_elems[0];
      ptVar34 = (type *)((long)ptVar34 + ((ulong)bVar42 * -2 + 1) * 4);
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
    }
    *(int *)((long)(&(pnVar11->m_backend).data + 1) + local_c78) = t.m_backend.exp;
    *(bool *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 4U) = t.m_backend.neg;
    *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + local_c78 + 8U) = t.m_backend._120_8_;
    updateFtest(this);
    puVar35 = (uint *)local_928;
    pnVar30 = &local_5b0;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar30->m_backend).data._M_elems[0] = *puVar35;
      puVar35 = puVar35 + (ulong)bVar42 * -2 + 1;
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
    }
    local_5b0.m_backend.exp = iStack_8b8;
    local_5b0.m_backend.neg = (bool)uStack_8b4;
    local_5b0.m_backend.fpclass = (fpclass_type)local_8b0;
    local_5b0.m_backend.prec_elem = local_8b0._4_4_;
    updateNonbasicValue(this,&local_5b0);
    (**(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)(pSVar40,(ulong)uVar23,&local_c70,local_c98,&this->theFvec->thedelta);
  }
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&t,this);
  if (((leaveMax.m_backend.fpclass == cpp_dec_float_NaN) ||
      (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&leaveMax.m_backend,&t.m_backend), iVar17 < 1)) {
LAB_0050f0c0:
    entertol(&newUBbound,this);
    pnVar30 = &newUBbound;
    pnVar33 = &enterBound;
    for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
      (pnVar33->m_backend).data._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
      pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
      pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar33 + ((ulong)bVar42 * -2 + 1) * 4);
    }
    enterBound.m_backend.exp = newUBbound.m_backend.exp;
    enterBound.m_backend.neg = newUBbound.m_backend.neg;
    enterBound.m_backend.fpclass = newUBbound.m_backend.fpclass;
    enterBound.m_backend.prec_elem = newUBbound.m_backend.prec_elem;
    if (enterBound.m_backend.data._M_elems[0] != 0 ||
        newUBbound.m_backend.fpclass != cpp_dec_float_finite) {
      enterBound.m_backend.neg = (bool)(newUBbound.m_backend.neg ^ 1);
    }
    if (((newUBbound.m_backend.fpclass != cpp_dec_float_NaN) &&
        (leaveMax.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&leaveMax.m_backend,&enterBound.m_backend), iVar17 < 0)) {
      entertol(&newCoPrhs,this);
      pnVar30 = &newCoPrhs;
      pnVar33 = &newLBbound;
      for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
        (pnVar33->m_backend).data._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
        pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar30 + ((ulong)bVar42 * -2 + 1) * 4);
        pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar33 + ((ulong)bVar42 * -2 + 1) * 4);
      }
      newLBbound.m_backend.exp = newCoPrhs.m_backend.exp;
      newLBbound.m_backend.neg = newCoPrhs.m_backend.neg;
      newLBbound.m_backend.fpclass = newCoPrhs.m_backend.fpclass;
      newLBbound.m_backend.prec_elem = newCoPrhs.m_backend.prec_elem;
      if (newLBbound.m_backend.data._M_elems[0] != 0 ||
          newCoPrhs.m_backend.fpclass != cpp_dec_float_finite) {
        newLBbound.m_backend.neg = (bool)(newCoPrhs.m_backend.neg ^ 1);
      }
      if (((newCoPrhs.m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_ab8.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_ab8,&newLBbound.m_backend), -1 < iVar17)) goto LAB_0050f1e1;
    }
    this->m_numCycle = this->m_numCycle / 2;
  }
  else {
    entertol(&reject_treshold,this);
    if (((local_ab8.fpclass == cpp_dec_float_NaN) ||
        (reject_treshold.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_ab8,&reject_treshold.m_backend), 0 < iVar17)) goto LAB_0050f0c0;
LAB_0050f1e1:
    pcVar32 = &(this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
    ::soplex::infinity::__tls_init();
    local_c98 = *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    uStack_c90 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,(double)local_c98);
    if (((pcVar32->fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar32,&t.m_backend), -1 < iVar17)) {
      pcVar32 = &(this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
      ::soplex::infinity::__tls_init();
      reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
      reject_treshold.m_backend.prec_elem = 0x1c;
      reject_treshold.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems[0x18] = 0;
      reject_treshold.m_backend.data._M_elems[0x19] = 0;
      reject_treshold.m_backend.data._M_elems._104_5_ = 0;
      reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      reject_treshold.m_backend.exp = 0;
      reject_treshold.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&reject_treshold,
                 (double)((ulong)local_c98 ^ (ulong)DAT_005f4010));
      if (((pcVar32->fpclass != cpp_dec_float_NaN) &&
          (reject_treshold.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar32,&reject_treshold.m_backend), 0 < iVar17 && leaveStat != P_FREE
         )) goto LAB_0050f52a;
    }
    else if (leaveStat != P_FREE) {
LAB_0050f52a:
      if (leaveStat != D_FREE) {
        this->m_numCycle = this->m_numCycle + 1;
        this->leaveCycles = this->leaveCycles + 1;
        return (bool)1;
      }
      return (bool)1;
    }
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}